

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O0

Vector * clip(Vector *__return_storage_ptr__,Vector *v)

{
  double *pdVar1;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  Vector *local_18;
  Vector *v_local;
  
  local_20 = 0.0;
  local_28 = 1.0;
  local_18 = v;
  v_local = __return_storage_ptr__;
  pdVar1 = std::min<double>(&v->x,&local_28);
  pdVar1 = std::max<double>(&local_20,pdVar1);
  v->x = *pdVar1;
  local_30 = 0.0;
  local_38 = 1.0;
  pdVar1 = std::min<double>(&v->y,&local_38);
  pdVar1 = std::max<double>(&local_30,pdVar1);
  v->y = *pdVar1;
  local_40 = 0.0;
  local_48 = 1.0;
  pdVar1 = std::min<double>(&v->z,&local_48);
  pdVar1 = std::max<double>(&local_40,pdVar1);
  v->z = *pdVar1;
  Vector::Vector(__return_storage_ptr__,v);
  return __return_storage_ptr__;
}

Assistant:

inline Vector clip(Vector v)
{
    // when libc++ catches up with c++17:
    // v.x = std::clamp(v.x, 0.0, 1.0);
    // v.y = std::clamp(v.y, 0.0, 1.0);
    // v.z = std::clamp(v.z, 0.0, 1.0);

    v.x = std::max(0.0, std::min(v.x, 1.0));
    v.y = std::max(0.0, std::min(v.y, 1.0));
    v.z = std::max(0.0, std::min(v.z, 1.0));
    return v;
}